

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O1

cupdlp_int nrminfindex(cupdlp_int n,double *x,cupdlp_int incx)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  if (0 < n) {
    uVar2 = 0;
    dVar3 = 0.0;
    uVar1 = 0;
    do {
      if (dVar3 < ABS(x[uVar2])) {
        uVar1 = uVar2 & 0xffffffff;
        dVar3 = ABS(x[uVar2]);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
    return (cupdlp_int)uVar1;
  }
  return 0;
}

Assistant:

cupdlp_int nrminfindex(cupdlp_int n, const double *x, cupdlp_int incx) {
#ifdef USE_MY_BLAS
  assert(incx == 1);

  double nrm = 0.0;
  cupdlp_int index = 0;

  for (int i = 0; i < n; ++i) {
    double tmp = fabs(x[i]);
    if (tmp > nrm) {
      nrm = tmp;
      index = i;
    }
  }

  return index;
#else
  return dnrminfindex(n, x, incx);
#endif
}